

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

void substr(char *s,int *start,int *count,int *numargs)

{
  tagval *this;
  int iVar1;
  size_t sVar2;
  char *val;
  int local_44;
  int offset;
  int len;
  int *numargs_local;
  int *count_local;
  int *start_local;
  char *s_local;
  
  sVar2 = strlen(s);
  local_44 = (int)sVar2;
  iVar1 = clamp<int,int>(*start,0,local_44);
  this = commandret;
  if (*numargs < 3) {
    local_44 = local_44 - iVar1;
  }
  else {
    local_44 = clamp<int,int>(*count,0,local_44 - iVar1);
  }
  val = newstring(s + iVar1,(long)local_44);
  tagval::setstr(this,val);
  return;
}

Assistant:

void substr(char *s, int *start, int *count, int *numargs)
{
    int len = strlen(s), offset = clamp(*start, 0, len);
    commandret->setstr(newstring(&s[offset], *numargs >= 3 ? clamp(*count, 0, len - offset) : len - offset));
}